

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O3

wchar_t o_cmp_tval(void *a,void *b)

{
  _Bool _Var1;
  wchar_t wVar2;
  object_kind *poVar3;
  object_kind *poVar4;
  
  wVar2 = k_info[*a].tval;
  if (obj_group_order[wVar2] - obj_group_order[k_info[*b].tval] != L'\0') {
    return obj_group_order[wVar2] - obj_group_order[k_info[*b].tval];
  }
  poVar4 = k_info + *a;
  poVar3 = k_info + *b;
  _Var1 = poVar4->aware;
  if (_Var1 != poVar3->aware) {
    return (uint)poVar3->aware - (uint)_Var1;
  }
  if (((uint)wVar2 < 0x23) && ((0x7c00c0000U >> ((ulong)(uint)wVar2 & 0x3f) & 1) != 0)) {
    return poVar4->sval - poVar3->sval;
  }
  if (_Var1 != 0) {
    wVar2 = strcmp(poVar4->name,poVar3->name);
    return wVar2;
  }
  if (poVar4->tried == poVar3->tried) {
    wVar2 = strcmp(poVar4->flavor->text,poVar3->flavor->text);
    return wVar2;
  }
  return (uint)poVar3->tried - (uint)poVar4->tried;
}

Assistant:

static int o_cmp_tval(const void *a, const void *b)
{
	const int a_val = *(const int *)a;
	const int b_val = *(const int *)b;
	const struct object_kind *k_a = &k_info[a_val];
	const struct object_kind *k_b = &k_info[b_val];

	/* Group by */
	int ta = obj_group_order[k_a->tval];
	int tb = obj_group_order[k_b->tval];
	int c = ta - tb;
	if (c) return c;

	/* Order by */
	c = k_a->aware - k_b->aware;
	if (c) return -c; /* aware has low sort weight */

	switch (k_a->tval)
	{
		case TV_LIGHT:
		case TV_MAGIC_BOOK:
		case TV_PRAYER_BOOK:
		case TV_NATURE_BOOK:
		case TV_SHADOW_BOOK:
		case TV_OTHER_BOOK:
		case TV_DRAG_ARMOR:
			/* leave sorted by sval */
			break;

		default:
			if (k_a->aware)
				return strcmp(k_a->name, k_b->name);

			/* Then in tried order */
			c = k_a->tried - k_b->tried;
			if (c) return -c;

			return strcmp(k_a->flavor->text, k_b->flavor->text);
	}

	return k_a->sval - k_b->sval;
}